

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

int __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::Convert2Var(FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *this,AffineExpr *ee)

{
  bool bVar1;
  Var VVar2;
  NodeRange NVar3;
  LinearFunctionalConstraint local_c0;
  
  bVar1 = AlgebraicExpression<mp::LinTerms>::is_variable(ee);
  if (bVar1) {
    VVar2 = *(ee->super_LinTerms).vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
  }
  else if ((ee->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
           super_small_vector_data_base<double_*,_unsigned_long>.m_size == 0) {
    NVar3 = MakeFixedVar(this,ee->constant_term_);
    VVar2 = NVar3.ir_.beg_;
  }
  else {
    LinTerms::sort_terms(&ee->super_LinTerms,true);
    LinTerms::shrink_to_fit(&ee->super_LinTerms);
    LinearFunctionalConstraint::LinearFunctionalConstraint(&local_c0,ee);
    VVar2 = AssignResultVar2Args<mp::LinearFunctionalConstraint>(this,&local_c0);
    LinearFunctionalConstraint::~LinearFunctionalConstraint(&local_c0);
  }
  return VVar2;
}

Assistant:

int Convert2Var(AffineExpr&& ee) {
    if (ee.is_variable())
      return ee.get_representing_variable();
    if (ee.is_constant())
      return int( MakeFixedVar(ee.constant_term()) );
    ee.sort_terms();
    ee.shrink_to_fit();
    return AssignResultVar2Args(
            LinearFunctionalConstraint(std::move(ee)));
  }